

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void run_container_intersection(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  rle16_t *prVar1;
  rle16_t *prVar2;
  rle16_t *prVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  
  bVar15 = false;
  if ((src_1->n_runs == 1) && (bVar15 = false, src_1->runs->value == 0)) {
    bVar15 = src_1->runs->length == 0xffff;
  }
  bVar16 = false;
  if ((src_2->n_runs == 1) && (bVar16 = false, src_2->runs->value == 0)) {
    bVar16 = src_2->runs->length == 0xffff;
  }
  if (((bool)(bVar16 | bVar15)) && ((bool)(bVar16 | bVar15))) {
    if (bVar15) {
      src_1 = src_2;
    }
    run_container_copy(src_1,dst);
    return;
  }
  iVar5 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar5) {
    run_container_grow(dst,iVar5,false);
  }
  dst->n_runs = 0;
  iVar5 = src_1->n_runs;
  if (0 < iVar5) {
    prVar1 = src_1->runs;
    prVar2 = src_2->runs;
    uVar4 = (uint)prVar2->value;
    uVar13 = (uint)prVar2->value + (uint)prVar2->length + 1;
    uVar7 = (uint)prVar1->value;
    uVar11 = (uint)prVar1->value + (uint)prVar1->length + 1;
    iVar6 = 0;
    iVar9 = 0;
    do {
      iVar10 = src_2->n_runs;
      if (iVar10 <= iVar6) {
        return;
      }
      if (uVar4 < uVar11) {
        if (uVar7 < uVar13) {
          uVar14 = uVar4;
          if (uVar4 < uVar7) {
            uVar14 = uVar7;
          }
          uVar12 = uVar11;
          if (uVar11 == uVar13) {
            iVar8 = iVar9 + 1;
            if (iVar8 < iVar5) {
              uVar7 = (uint)prVar1[iVar8].value;
              uVar11 = uVar7 + prVar1[iVar8].length + 1;
            }
            iVar6 = iVar6 + 1;
            if (iVar6 < iVar10) {
              uVar4 = (uint)prVar2[iVar6].value;
              iVar9 = iVar8;
              uVar13 = uVar4 + prVar2[iVar6].length + 1;
            }
            else {
LAB_0011f84a:
              iVar9 = iVar9 + 1;
            }
          }
          else {
            if (uVar11 < uVar13) {
              iVar10 = iVar9 + 1;
              if (iVar10 < iVar5) {
                uVar7 = (uint)prVar1[iVar10].value;
                uVar11 = uVar7 + prVar1[iVar10].length + 1;
              }
              goto LAB_0011f84a;
            }
            iVar6 = iVar6 + 1;
            uVar12 = uVar13;
            if (iVar6 < iVar10) {
              uVar4 = (uint)prVar2[iVar6].value;
              uVar13 = prVar2[iVar6].length + uVar4 + 1;
            }
          }
          prVar3 = dst->runs;
          iVar5 = dst->n_runs;
          prVar3[iVar5].value = (ushort)uVar14;
          prVar3[iVar5].length = ~(ushort)uVar14 + (short)uVar12;
          dst->n_runs = iVar5 + 1;
        }
        else {
          iVar6 = iVar6 + 1;
          if (iVar6 < iVar10) {
            uVar4 = (uint)prVar2[iVar6].value;
            uVar13 = prVar2[iVar6].length + uVar4 + 1;
          }
        }
      }
      else {
        iVar9 = iVar9 + 1;
        if (iVar9 < iVar5) {
          uVar7 = (uint)prVar1[iVar9].value;
          uVar11 = prVar1[iVar9].length + uVar7 + 1;
        }
      }
      iVar5 = src_1->n_runs;
    } while (iVar9 < iVar5);
  }
  return;
}

Assistant:

void run_container_intersection(const run_container_t *src_1,
                                const run_container_t *src_2,
                                run_container_t *dst) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_2, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_1, dst);
            return;
        }
    }
    // TODO: this could be a lot more efficient, could use SIMD optimizations
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            dst->runs[dst->n_runs].value = (uint16_t)lateststart;
            dst->runs[dst->n_runs].length =
                (uint16_t)(earliestend - lateststart - 1);
            dst->n_runs++;
        }
    }
}